

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  Scene *pSVar5;
  Ref<embree::Geometry> *pRVar6;
  Geometry *pGVar7;
  long lVar8;
  long lVar9;
  RTCIntersectArguments *pRVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  bool bVar53;
  AABBNodeMB4D *node1;
  ulong uVar54;
  ulong uVar55;
  long lVar56;
  int iVar57;
  long lVar58;
  ulong uVar59;
  long lVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  long lVar64;
  ulong uVar65;
  ulong uVar66;
  ulong uVar67;
  ulong uVar68;
  ulong uVar69;
  ulong uVar70;
  ulong uVar71;
  undefined4 uVar72;
  ulong unaff_R13;
  size_t mask;
  ulong uVar73;
  ulong uVar74;
  bool bVar75;
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar80 [32];
  float fVar87;
  float fVar88;
  float fVar93;
  float fVar94;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  float fVar104;
  float fVar105;
  float fVar106;
  undefined1 auVar101 [32];
  float fVar103;
  float fVar107;
  undefined1 auVar102 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar117;
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  float fVar118;
  float fVar128;
  float fVar129;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar125 [32];
  float fVar130;
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  float fVar134;
  float fVar135;
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar138 [64];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  float fVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  float fVar161;
  float fVar165;
  undefined1 auVar157 [32];
  float fVar159;
  float fVar160;
  float fVar162;
  float fVar163;
  float fVar164;
  undefined1 auVar158 [64];
  float fVar167;
  undefined1 auVar166 [64];
  float fVar168;
  undefined1 auVar169 [32];
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar170 [64];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar186;
  undefined1 auVar187 [32];
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  undefined1 auVar188 [64];
  float fVar195;
  float fVar196;
  undefined1 auVar197 [32];
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  undefined1 auVar198 [64];
  float fVar211;
  float fVar213;
  undefined1 auVar212 [64];
  undefined1 auVar214 [16];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  float fVar217;
  float fVar218;
  float fVar220;
  float fVar221;
  float fVar222;
  float fVar223;
  float fVar224;
  float fVar225;
  float fVar226;
  float fVar227;
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar231;
  undefined1 auVar219 [64];
  Scene *scene;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_e04;
  ulong local_e00;
  ulong local_df8;
  ulong local_df0;
  ulong local_de8;
  ulong local_de0;
  ulong *local_dd8;
  undefined1 local_dd0 [16];
  undefined1 local_dc0 [16];
  undefined1 local_db0 [16];
  undefined1 local_da0 [16];
  undefined1 local_d90 [16];
  undefined1 local_d80 [16];
  undefined1 local_d70 [16];
  undefined1 local_d60 [16];
  undefined1 local_d50 [16];
  float local_d40;
  float fStack_d3c;
  float fStack_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float fStack_d28;
  float fStack_d24;
  ulong local_d08;
  ulong local_d00;
  ulong local_cf8;
  long local_cf0;
  ulong local_ce8;
  undefined4 local_ce0;
  float local_cdc;
  float local_cd8;
  undefined4 local_cd4;
  undefined4 local_cd0;
  undefined4 local_ccc;
  uint local_cc8;
  uint local_cc4;
  uint local_cc0;
  RTCFilterFunctionNArguments local_cb0;
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined1 local_c60 [32];
  undefined1 local_c40 [8];
  float fStack_c38;
  float fStack_c34;
  undefined1 local_c20 [8];
  float fStack_c18;
  float fStack_c14;
  undefined1 local_c00 [8];
  float fStack_bf8;
  float fStack_bf4;
  undefined1 local_be0 [32];
  undefined1 local_bc0 [8];
  float fStack_bb8;
  float fStack_bb4;
  undefined1 local_ba0 [8];
  float fStack_b98;
  float fStack_b94;
  undefined4 uStack_b84;
  undefined1 local_b80 [32];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 local_b20 [32];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  undefined1 local_ab0 [8];
  float fStack_aa8;
  float fStack_aa4;
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [16];
  undefined1 local_a50 [8];
  float fStack_a48;
  float fStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0;
  float fStack_9bc;
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  float local_840 [4];
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined4 uStack_824;
  undefined1 local_820 [32];
  ulong local_800;
  ulong local_7f8 [249];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar118 = ray->tfar;
    if (0.0 <= fVar118) {
      local_dd8 = local_7f8;
      local_800 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
      aVar4 = (ray->dir).field_0;
      auVar89 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar78._8_4_ = 0x7fffffff;
      auVar78._0_8_ = 0x7fffffff7fffffff;
      auVar78._12_4_ = 0x7fffffff;
      auVar78 = vandps_avx((undefined1  [16])aVar4,auVar78);
      auVar119._8_4_ = 0x219392ef;
      auVar119._0_8_ = 0x219392ef219392ef;
      auVar119._12_4_ = 0x219392ef;
      auVar78 = vcmpps_avx(auVar78,auVar119,1);
      auVar120._8_4_ = 0x3f800000;
      auVar120._0_8_ = &DAT_3f8000003f800000;
      auVar120._12_4_ = 0x3f800000;
      auVar119 = vdivps_avx(auVar120,(undefined1  [16])aVar4);
      auVar121._8_4_ = 0x5d5e0b6b;
      auVar121._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar121._12_4_ = 0x5d5e0b6b;
      auVar78 = vblendvps_avx(auVar119,auVar121,auVar78);
      auVar108._0_4_ = auVar78._0_4_ * 0.99999964;
      auVar108._4_4_ = auVar78._4_4_ * 0.99999964;
      auVar108._8_4_ = auVar78._8_4_ * 0.99999964;
      auVar108._12_4_ = auVar78._12_4_ * 0.99999964;
      auVar95._0_4_ = auVar78._0_4_ * 1.0000004;
      auVar95._4_4_ = auVar78._4_4_ * 1.0000004;
      auVar95._8_4_ = auVar78._8_4_ * 1.0000004;
      auVar95._12_4_ = auVar78._12_4_ * 1.0000004;
      uVar72 = *(undefined4 *)&(ray->org).field_0;
      local_d50._4_4_ = uVar72;
      local_d50._0_4_ = uVar72;
      local_d50._8_4_ = uVar72;
      local_d50._12_4_ = uVar72;
      auVar158 = ZEXT1664(local_d50);
      uVar72 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_d60._4_4_ = uVar72;
      local_d60._0_4_ = uVar72;
      local_d60._8_4_ = uVar72;
      local_d60._12_4_ = uVar72;
      auVar166 = ZEXT1664(local_d60);
      uVar72 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_d70._4_4_ = uVar72;
      local_d70._0_4_ = uVar72;
      local_d70._8_4_ = uVar72;
      local_d70._12_4_ = uVar72;
      auVar170 = ZEXT1664(local_d70);
      _local_a50 = vshufps_avx(auVar108,auVar108,0);
      auVar78 = vmovshdup_avx(auVar108);
      local_d80 = vshufps_avx(auVar108,auVar108,0x55);
      auVar188 = ZEXT1664(local_d80);
      auVar119 = vshufpd_avx(auVar108,auVar108,1);
      local_d90 = vshufps_avx(auVar108,auVar108,0xaa);
      auVar198 = ZEXT1664(local_d90);
      local_da0 = vshufps_avx(auVar95,auVar95,0);
      auVar212 = ZEXT1664(local_da0);
      local_db0 = vshufps_avx(auVar95,auVar95,0x55);
      auVar216 = ZEXT1664(local_db0);
      uVar62 = (ulong)(auVar108._0_4_ < 0.0) << 4;
      uVar66 = (ulong)(auVar78._0_4_ < 0.0) << 4 | 0x20;
      local_dc0 = vshufps_avx(auVar95,auVar95,0xaa);
      auVar138 = ZEXT1664(local_dc0);
      uVar70 = (ulong)(auVar119._0_4_ < 0.0) << 4 | 0x40;
      uVar59 = uVar62 ^ 0x10;
      uVar74 = uVar66 ^ 0x10;
      local_ce8 = uVar70 ^ 0x10;
      local_dd0 = vshufps_avx(auVar89,auVar89,0);
      auVar219 = ZEXT1664(local_dd0);
      local_a60 = vshufps_avx(ZEXT416((uint)fVar118),ZEXT416((uint)fVar118),0);
      local_a20._16_16_ = mm_lookupmask_ps._240_16_;
      local_a20._0_16_ = mm_lookupmask_ps._0_16_;
      auVar183._8_4_ = 0x3f800000;
      auVar183._0_8_ = &DAT_3f8000003f800000;
      auVar183._12_4_ = 0x3f800000;
      auVar183._16_4_ = 0x3f800000;
      auVar183._20_4_ = 0x3f800000;
      auVar183._24_4_ = 0x3f800000;
      auVar183._28_4_ = 0x3f800000;
      auVar80._8_4_ = 0xbf800000;
      auVar80._0_8_ = 0xbf800000bf800000;
      auVar80._12_4_ = 0xbf800000;
      auVar80._16_4_ = 0xbf800000;
      auVar80._20_4_ = 0xbf800000;
      auVar80._24_4_ = 0xbf800000;
      auVar80._28_4_ = 0xbf800000;
      local_a40 = vblendvps_avx(auVar183,auVar80,local_a20);
      local_e00 = uVar74;
      local_df8 = uVar59;
      local_df0 = uVar70;
      local_de8 = uVar66;
      local_de0 = uVar62;
      do {
        if (local_dd8 == &local_800) {
          return;
        }
        uVar73 = local_dd8[-1];
        local_dd8 = local_dd8 + -1;
        do {
          if ((uVar73 & 8) == 0) {
            uVar54 = uVar73 & 0xfffffffffffffff0;
            fVar118 = (ray->dir).field_0.m128[3];
            auVar77._4_4_ = fVar118;
            auVar77._0_4_ = fVar118;
            auVar77._8_4_ = fVar118;
            auVar77._12_4_ = fVar118;
            pfVar2 = (float *)(uVar54 + 0x80 + uVar62);
            pfVar1 = (float *)(uVar54 + 0x20 + uVar62);
            auVar89._0_4_ = fVar118 * *pfVar2 + *pfVar1;
            auVar89._4_4_ = fVar118 * pfVar2[1] + pfVar1[1];
            auVar89._8_4_ = fVar118 * pfVar2[2] + pfVar1[2];
            auVar89._12_4_ = fVar118 * pfVar2[3] + pfVar1[3];
            auVar78 = vsubps_avx(auVar89,auVar158._0_16_);
            auVar90._0_4_ = auVar78._0_4_ * (float)local_a50._0_4_;
            auVar90._4_4_ = auVar78._4_4_ * (float)local_a50._4_4_;
            auVar90._8_4_ = auVar78._8_4_ * fStack_a48;
            auVar90._12_4_ = auVar78._12_4_ * fStack_a44;
            auVar78 = vmaxps_avx(auVar219._0_16_,auVar90);
            pfVar2 = (float *)(uVar54 + 0x80 + uVar66);
            pfVar1 = (float *)(uVar54 + 0x20 + uVar66);
            auVar96._0_4_ = fVar118 * *pfVar2 + *pfVar1;
            auVar96._4_4_ = fVar118 * pfVar2[1] + pfVar1[1];
            auVar96._8_4_ = fVar118 * pfVar2[2] + pfVar1[2];
            auVar96._12_4_ = fVar118 * pfVar2[3] + pfVar1[3];
            auVar119 = vsubps_avx(auVar96,auVar166._0_16_);
            auVar97._0_4_ = auVar188._0_4_ * auVar119._0_4_;
            auVar97._4_4_ = auVar188._4_4_ * auVar119._4_4_;
            auVar97._8_4_ = auVar188._8_4_ * auVar119._8_4_;
            auVar97._12_4_ = auVar188._12_4_ * auVar119._12_4_;
            pfVar2 = (float *)(uVar54 + 0x80 + uVar70);
            pfVar1 = (float *)(uVar54 + 0x20 + uVar70);
            auVar109._0_4_ = fVar118 * *pfVar2 + *pfVar1;
            auVar109._4_4_ = fVar118 * pfVar2[1] + pfVar1[1];
            auVar109._8_4_ = fVar118 * pfVar2[2] + pfVar1[2];
            auVar109._12_4_ = fVar118 * pfVar2[3] + pfVar1[3];
            auVar119 = vsubps_avx(auVar109,auVar170._0_16_);
            auVar110._0_4_ = auVar198._0_4_ * auVar119._0_4_;
            auVar110._4_4_ = auVar198._4_4_ * auVar119._4_4_;
            auVar110._8_4_ = auVar198._8_4_ * auVar119._8_4_;
            auVar110._12_4_ = auVar198._12_4_ * auVar119._12_4_;
            auVar119 = vmaxps_avx(auVar97,auVar110);
            auVar78 = vmaxps_avx(auVar78,auVar119);
            pfVar2 = (float *)(uVar54 + 0x80 + uVar59);
            pfVar1 = (float *)(uVar54 + 0x20 + uVar59);
            auVar98._0_4_ = fVar118 * *pfVar2 + *pfVar1;
            auVar98._4_4_ = fVar118 * pfVar2[1] + pfVar1[1];
            auVar98._8_4_ = fVar118 * pfVar2[2] + pfVar1[2];
            auVar98._12_4_ = fVar118 * pfVar2[3] + pfVar1[3];
            auVar119 = vsubps_avx(auVar98,auVar158._0_16_);
            auVar99._0_4_ = auVar212._0_4_ * auVar119._0_4_;
            auVar99._4_4_ = auVar212._4_4_ * auVar119._4_4_;
            auVar99._8_4_ = auVar212._8_4_ * auVar119._8_4_;
            auVar99._12_4_ = auVar212._12_4_ * auVar119._12_4_;
            pfVar2 = (float *)(uVar54 + 0x80 + uVar74);
            auVar119 = vminps_avx(local_a60,auVar99);
            pfVar1 = (float *)(uVar54 + 0x20 + uVar74);
            auVar111._0_4_ = fVar118 * *pfVar2 + *pfVar1;
            auVar111._4_4_ = fVar118 * pfVar2[1] + pfVar1[1];
            auVar111._8_4_ = fVar118 * pfVar2[2] + pfVar1[2];
            auVar111._12_4_ = fVar118 * pfVar2[3] + pfVar1[3];
            auVar89 = vsubps_avx(auVar111,auVar166._0_16_);
            pfVar2 = (float *)(uVar54 + 0x80 + local_ce8);
            pfVar1 = (float *)(uVar54 + 0x20 + local_ce8);
            auVar122._0_4_ = fVar118 * *pfVar2 + *pfVar1;
            auVar122._4_4_ = fVar118 * pfVar2[1] + pfVar1[1];
            auVar122._8_4_ = fVar118 * pfVar2[2] + pfVar1[2];
            auVar122._12_4_ = fVar118 * pfVar2[3] + pfVar1[3];
            auVar112._0_4_ = auVar216._0_4_ * auVar89._0_4_;
            auVar112._4_4_ = auVar216._4_4_ * auVar89._4_4_;
            auVar112._8_4_ = auVar216._8_4_ * auVar89._8_4_;
            auVar112._12_4_ = auVar216._12_4_ * auVar89._12_4_;
            auVar89 = vsubps_avx(auVar122,auVar170._0_16_);
            auVar123._0_4_ = auVar138._0_4_ * auVar89._0_4_;
            auVar123._4_4_ = auVar138._4_4_ * auVar89._4_4_;
            auVar123._8_4_ = auVar138._8_4_ * auVar89._8_4_;
            auVar123._12_4_ = auVar138._12_4_ * auVar89._12_4_;
            auVar89 = vminps_avx(auVar112,auVar123);
            auVar119 = vminps_avx(auVar119,auVar89);
            if (((uint)uVar73 & 7) == 6) {
              auVar119 = vcmpps_avx(auVar78,auVar119,2);
              auVar78 = vcmpps_avx(*(undefined1 (*) [16])(uVar54 + 0xe0),auVar77,2);
              auVar89 = vcmpps_avx(auVar77,*(undefined1 (*) [16])(uVar54 + 0xf0),1);
              auVar78 = vandps_avx(auVar78,auVar89);
              auVar78 = vandps_avx(auVar78,auVar119);
            }
            else {
              auVar78 = vcmpps_avx(auVar78,auVar119,2);
            }
            auVar78 = vpslld_avx(auVar78,0x1f);
            uVar72 = vmovmskps_avx(auVar78);
            unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),uVar72);
          }
          if ((uVar73 & 8) == 0) {
            if (unaff_R13 == 0) {
              iVar57 = 4;
            }
            else {
              uVar54 = uVar73 & 0xfffffffffffffff0;
              lVar58 = 0;
              if (unaff_R13 != 0) {
                for (; (unaff_R13 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                }
              }
              iVar57 = 0;
              uVar73 = *(ulong *)(uVar54 + lVar58 * 8);
              uVar61 = unaff_R13 - 1 & unaff_R13;
              if (uVar61 != 0) {
                *local_dd8 = uVar73;
                lVar58 = 0;
                if (uVar61 != 0) {
                  for (; (uVar61 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                  }
                }
                uVar55 = uVar61 - 1;
                while( true ) {
                  local_dd8 = local_dd8 + 1;
                  uVar73 = *(ulong *)(uVar54 + lVar58 * 8);
                  uVar55 = uVar55 & uVar61;
                  if (uVar55 == 0) break;
                  *local_dd8 = uVar73;
                  lVar58 = 0;
                  if (uVar55 != 0) {
                    for (; (uVar55 >> lVar58 & 1) == 0; lVar58 = lVar58 + 1) {
                    }
                  }
                  uVar61 = uVar55 - 1;
                }
              }
            }
          }
          else {
            iVar57 = 6;
          }
        } while (iVar57 == 0);
        if (iVar57 == 6) {
          iVar57 = 0;
          local_d08 = (ulong)((uint)uVar73 & 0xf) - 8;
          bVar75 = local_d08 != 0;
          if (bVar75) {
            uVar73 = uVar73 & 0xfffffffffffffff0;
            pSVar5 = context->scene;
            local_d00 = 0;
            do {
              lVar56 = local_d00 * 0x60;
              pRVar6 = (pSVar5->geometries).items;
              pGVar7 = pRVar6[*(uint *)(uVar73 + 0x40 + lVar56)].ptr;
              fVar118 = (pGVar7->time_range).lower;
              fVar118 = pGVar7->fnumTimeSegments *
                        (((ray->dir).field_0.m128[3] - fVar118) /
                        ((pGVar7->time_range).upper - fVar118));
              auVar78 = vroundss_avx(ZEXT416((uint)fVar118),ZEXT416((uint)fVar118),9);
              auVar78 = vminss_avx(auVar78,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
              auVar99 = vmaxss_avx(ZEXT816(0) << 0x20,auVar78);
              iVar57 = (int)auVar99._0_4_;
              lVar64 = (long)iVar57 * 0x38;
              lVar58 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar64);
              uVar63 = (ulong)*(uint *)(uVar73 + 4 + lVar56);
              auVar78 = *(undefined1 (*) [16])(lVar58 + (ulong)*(uint *)(uVar73 + lVar56) * 4);
              uVar62 = (ulong)*(uint *)(uVar73 + 0x10 + lVar56);
              auVar119 = *(undefined1 (*) [16])(lVar58 + uVar62 * 4);
              uVar66 = (ulong)*(uint *)(uVar73 + 0x20 + lVar56);
              auVar89 = *(undefined1 (*) [16])(lVar58 + uVar66 * 4);
              uVar70 = (ulong)*(uint *)(uVar73 + 0x30 + lVar56);
              auVar95 = *(undefined1 (*) [16])(lVar58 + uVar70 * 4);
              local_cf0 = *(long *)&pRVar6[*(uint *)(uVar73 + 0x44 + lVar56)].ptr[2].numPrimitives;
              lVar58 = *(long *)(local_cf0 + lVar64);
              auVar108 = *(undefined1 (*) [16])(lVar58 + uVar63 * 4);
              uVar74 = (ulong)*(uint *)(uVar73 + 0x14 + lVar56);
              auVar120 = *(undefined1 (*) [16])(lVar58 + uVar74 * 4);
              uVar54 = (ulong)*(uint *)(uVar73 + 0x24 + lVar56);
              auVar121 = *(undefined1 (*) [16])(lVar58 + uVar54 * 4);
              uVar61 = (ulong)*(uint *)(uVar73 + 0x34 + lVar56);
              auVar77 = *(undefined1 (*) [16])(lVar58 + uVar61 * 4);
              lVar58 = *(long *)&pRVar6[*(uint *)(uVar73 + 0x48 + lVar56)].ptr[2].numPrimitives;
              lVar8 = *(long *)(lVar58 + lVar64);
              uVar55 = (ulong)*(uint *)(uVar73 + 8 + lVar56);
              auVar90 = *(undefined1 (*) [16])(lVar8 + uVar55 * 4);
              local_cf8 = (ulong)*(uint *)(uVar73 + 0x18 + lVar56);
              auVar96 = *(undefined1 (*) [16])(lVar8 + local_cf8 * 4);
              uVar67 = (ulong)*(uint *)(uVar73 + 0x28 + lVar56);
              auVar97 = *(undefined1 (*) [16])(lVar8 + uVar67 * 4);
              uVar68 = (ulong)*(uint *)(uVar73 + 0x38 + lVar56);
              auVar98 = *(undefined1 (*) [16])(lVar8 + uVar68 * 4);
              fVar118 = fVar118 - auVar99._0_4_;
              lVar8 = *(long *)&pRVar6[*(uint *)(uVar73 + 0x4c + lVar56)].ptr[2].numPrimitives;
              lVar64 = *(long *)(lVar8 + lVar64);
              uVar59 = (ulong)*(uint *)(uVar73 + 0xc + lVar56);
              auVar99 = *(undefined1 (*) [16])(lVar64 + uVar59 * 4);
              uVar71 = (ulong)*(uint *)(uVar73 + 0x1c + lVar56);
              auVar109 = *(undefined1 (*) [16])(lVar64 + uVar71 * 4);
              auVar110 = vunpcklps_avx(auVar78,auVar90);
              auVar90 = vunpckhps_avx(auVar78,auVar90);
              auVar111 = vunpcklps_avx(auVar108,auVar99);
              auVar108 = vunpckhps_avx(auVar108,auVar99);
              uVar65 = (ulong)*(uint *)(uVar73 + 0x2c + lVar56);
              auVar78 = *(undefined1 (*) [16])(lVar64 + uVar65 * 4);
              auVar99 = vunpcklps_avx(auVar90,auVar108);
              _local_a70 = vunpcklps_avx(auVar110,auVar111);
              auVar108 = vunpckhps_avx(auVar110,auVar111);
              auVar110 = vunpcklps_avx(auVar119,auVar96);
              auVar90 = vunpckhps_avx(auVar119,auVar96);
              auVar96 = vunpcklps_avx(auVar120,auVar109);
              auVar120 = vunpckhps_avx(auVar120,auVar109);
              uVar69 = (ulong)*(uint *)(uVar73 + 0x3c + lVar56);
              auVar119 = *(undefined1 (*) [16])(lVar64 + uVar69 * 4);
              auVar90 = vunpcklps_avx(auVar90,auVar120);
              auVar109 = vunpcklps_avx(auVar110,auVar96);
              auVar120 = vunpckhps_avx(auVar110,auVar96);
              auVar96 = vunpcklps_avx(auVar89,auVar97);
              auVar89 = vunpckhps_avx(auVar89,auVar97);
              auVar97 = vunpcklps_avx(auVar121,auVar78);
              auVar121 = vunpckhps_avx(auVar121,auVar78);
              lVar60 = (long)(iVar57 + 1) * 0x38;
              lVar64 = *(long *)(*(long *)&pGVar7[2].numPrimitives + lVar60);
              auVar78 = *(undefined1 (*) [16])(lVar64 + (ulong)*(uint *)(uVar73 + lVar56) * 4);
              _local_a80 = vunpcklps_avx(auVar89,auVar121);
              _local_ac0 = vunpcklps_avx(auVar96,auVar97);
              _local_ab0 = vunpckhps_avx(auVar96,auVar97);
              auVar121 = vunpcklps_avx(auVar95,auVar98);
              auVar89 = vunpckhps_avx(auVar95,auVar98);
              auVar96 = vunpcklps_avx(auVar77,auVar119);
              auVar95 = vunpckhps_avx(auVar77,auVar119);
              lVar58 = *(long *)(lVar58 + lVar60);
              auVar119 = *(undefined1 (*) [16])(lVar58 + uVar55 * 4);
              _local_a90 = vunpcklps_avx(auVar89,auVar95);
              auVar97 = vunpcklps_avx(auVar121,auVar96);
              _local_aa0 = vunpckhps_avx(auVar121,auVar96);
              lVar9 = *(long *)(local_cf0 + lVar60);
              auVar95 = vunpcklps_avx(auVar78,auVar119);
              auVar89 = vunpckhps_avx(auVar78,auVar119);
              auVar78 = *(undefined1 (*) [16])(lVar9 + uVar63 * 4);
              lVar8 = *(long *)(lVar8 + lVar60);
              auVar119 = *(undefined1 (*) [16])(lVar8 + uVar59 * 4);
              auVar121 = vunpcklps_avx(auVar78,auVar119);
              auVar78 = vunpckhps_avx(auVar78,auVar119);
              auVar96 = vunpcklps_avx(auVar89,auVar78);
              auVar98 = vunpcklps_avx(auVar95,auVar121);
              auVar89 = vunpckhps_avx(auVar95,auVar121);
              auVar78 = *(undefined1 (*) [16])(lVar64 + uVar62 * 4);
              auVar119 = *(undefined1 (*) [16])(lVar58 + local_cf8 * 4);
              auVar121 = vunpcklps_avx(auVar78,auVar119);
              auVar95 = vunpckhps_avx(auVar78,auVar119);
              auVar78 = *(undefined1 (*) [16])(lVar9 + uVar74 * 4);
              auVar119 = *(undefined1 (*) [16])(lVar8 + uVar71 * 4);
              auVar77 = vunpcklps_avx(auVar78,auVar119);
              auVar78 = vunpckhps_avx(auVar78,auVar119);
              auVar110 = vunpcklps_avx(auVar95,auVar78);
              auVar111 = vunpcklps_avx(auVar121,auVar77);
              auVar95 = vunpckhps_avx(auVar121,auVar77);
              auVar78 = *(undefined1 (*) [16])(lVar64 + uVar66 * 4);
              auVar119 = *(undefined1 (*) [16])(lVar58 + uVar67 * 4);
              auVar77 = vunpcklps_avx(auVar78,auVar119);
              auVar121 = vunpckhps_avx(auVar78,auVar119);
              auVar78 = *(undefined1 (*) [16])(lVar9 + uVar54 * 4);
              auVar119 = *(undefined1 (*) [16])(lVar8 + uVar65 * 4);
              auVar112 = vunpcklps_avx(auVar78,auVar119);
              auVar78 = vunpckhps_avx(auVar78,auVar119);
              auVar122 = vunpcklps_avx(auVar121,auVar78);
              auVar123 = vunpcklps_avx(auVar77,auVar112);
              auVar121 = vunpckhps_avx(auVar77,auVar112);
              auVar78 = *(undefined1 (*) [16])(lVar64 + uVar70 * 4);
              auVar119 = *(undefined1 (*) [16])(lVar58 + uVar68 * 4);
              auVar112 = vunpcklps_avx(auVar78,auVar119);
              auVar77 = vunpckhps_avx(auVar78,auVar119);
              auVar78 = *(undefined1 (*) [16])(lVar9 + uVar61 * 4);
              auVar119 = *(undefined1 (*) [16])(lVar8 + uVar69 * 4);
              auVar79 = vunpcklps_avx(auVar78,auVar119);
              auVar78 = vunpckhps_avx(auVar78,auVar119);
              auVar24 = vunpcklps_avx(auVar77,auVar78);
              auVar136 = vunpcklps_avx(auVar112,auVar79);
              auVar77 = vunpckhps_avx(auVar112,auVar79);
              auVar78 = vshufps_avx(ZEXT416((uint)fVar118),ZEXT416((uint)fVar118),0);
              auVar119 = vshufps_avx(ZEXT416((uint)(1.0 - fVar118)),ZEXT416((uint)(1.0 - fVar118)),0
                                    );
              fVar118 = auVar78._0_4_;
              fVar14 = auVar78._4_4_;
              fVar15 = auVar78._8_4_;
              fVar16 = auVar78._12_4_;
              fVar87 = auVar119._0_4_;
              fVar93 = auVar119._4_4_;
              fVar94 = auVar119._8_4_;
              fVar103 = auVar119._12_4_;
              auVar91._4_4_ = fVar93 * (float)local_a70._4_4_ + auVar98._4_4_ * fVar14;
              auVar91._0_4_ = fVar87 * (float)local_a70._0_4_ + auVar98._0_4_ * fVar118;
              auVar91._8_4_ = fVar94 * fStack_a68 + auVar98._8_4_ * fVar15;
              auVar91._12_4_ = fVar103 * fStack_a64 + auVar98._12_4_ * fVar16;
              local_c20._0_4_ = auVar108._0_4_;
              local_c20._4_4_ = auVar108._4_4_;
              fStack_c18 = auVar108._8_4_;
              fStack_c14 = auVar108._12_4_;
              auVar113._4_4_ = fVar93 * (float)local_c20._4_4_ + fVar14 * auVar89._4_4_;
              auVar113._0_4_ = fVar87 * (float)local_c20._0_4_ + fVar118 * auVar89._0_4_;
              auVar113._8_4_ = fVar94 * fStack_c18 + fVar15 * auVar89._8_4_;
              auVar113._12_4_ = fVar103 * fStack_c14 + fVar16 * auVar89._12_4_;
              local_bc0._0_4_ = auVar99._0_4_;
              local_bc0._4_4_ = auVar99._4_4_;
              fStack_bb8 = auVar99._8_4_;
              fStack_bb4 = auVar99._12_4_;
              auVar151._4_4_ = fVar93 * (float)local_bc0._4_4_ + auVar96._4_4_ * fVar14;
              auVar151._0_4_ = fVar87 * (float)local_bc0._0_4_ + auVar96._0_4_ * fVar118;
              auVar151._8_4_ = fVar94 * fStack_bb8 + auVar96._8_4_ * fVar15;
              auVar151._12_4_ = fVar103 * fStack_bb4 + auVar96._12_4_ * fVar16;
              local_c40._0_4_ = auVar109._0_4_;
              local_c40._4_4_ = auVar109._4_4_;
              fStack_c38 = auVar109._8_4_;
              fStack_c34 = auVar109._12_4_;
              auVar155._0_4_ = fVar87 * (float)local_c40._0_4_ + fVar118 * auVar111._0_4_;
              auVar155._4_4_ = fVar93 * (float)local_c40._4_4_ + fVar14 * auVar111._4_4_;
              auVar155._8_4_ = fVar94 * fStack_c38 + fVar15 * auVar111._8_4_;
              auVar155._12_4_ = fVar103 * fStack_c34 + fVar16 * auVar111._12_4_;
              local_c00._0_4_ = auVar120._0_4_;
              local_c00._4_4_ = auVar120._4_4_;
              fStack_bf8 = auVar120._8_4_;
              fStack_bf4 = auVar120._12_4_;
              auVar100._0_4_ = fVar87 * (float)local_c00._0_4_ + auVar95._0_4_ * fVar118;
              auVar100._4_4_ = fVar93 * (float)local_c00._4_4_ + auVar95._4_4_ * fVar14;
              auVar100._8_4_ = fVar94 * fStack_bf8 + auVar95._8_4_ * fVar15;
              auVar100._12_4_ = fVar103 * fStack_bf4 + auVar95._12_4_ * fVar16;
              local_ba0._0_4_ = auVar90._0_4_;
              local_ba0._4_4_ = auVar90._4_4_;
              fStack_b98 = auVar90._8_4_;
              fStack_b94 = auVar90._12_4_;
              auVar214._0_4_ = fVar87 * (float)local_ba0._0_4_ + auVar110._0_4_ * fVar118;
              auVar214._4_4_ = fVar93 * (float)local_ba0._4_4_ + auVar110._4_4_ * fVar14;
              auVar214._8_4_ = fVar94 * fStack_b98 + auVar110._8_4_ * fVar15;
              auVar214._12_4_ = fVar103 * fStack_b94 + auVar110._12_4_ * fVar16;
              auVar91._20_4_ = fVar93 * (float)local_ac0._4_4_ + fVar14 * auVar123._4_4_;
              auVar91._16_4_ = fVar87 * (float)local_ac0._0_4_ + fVar118 * auVar123._0_4_;
              auVar91._24_4_ = fVar94 * fStack_ab8 + fVar15 * auVar123._8_4_;
              auVar91._28_4_ = fVar103 * fStack_ab4 + fVar16 * auVar123._12_4_;
              auVar113._20_4_ = fVar93 * (float)local_ab0._4_4_ + auVar121._4_4_ * fVar14;
              auVar113._16_4_ = fVar87 * (float)local_ab0._0_4_ + auVar121._0_4_ * fVar118;
              auVar113._24_4_ = fVar94 * fStack_aa8 + auVar121._8_4_ * fVar15;
              auVar113._28_4_ = fVar103 * fStack_aa4 + auVar121._12_4_ * fVar16;
              auVar151._20_4_ = fVar93 * (float)local_a80._4_4_ + auVar122._4_4_ * fVar14;
              auVar151._16_4_ = fVar87 * (float)local_a80._0_4_ + auVar122._0_4_ * fVar118;
              auVar151._24_4_ = fVar94 * fStack_a78 + auVar122._8_4_ * fVar15;
              auVar151._28_4_ = fVar103 * fStack_a74 + auVar122._12_4_ * fVar16;
              lVar58 = uVar73 + 0x40 + lVar56;
              local_9e0 = *(undefined8 *)(lVar58 + 0x10);
              uStack_9d8 = *(undefined8 *)(lVar58 + 0x18);
              auVar124._0_4_ = auVar97._0_4_ * fVar87 + fVar118 * auVar136._0_4_;
              auVar124._4_4_ = auVar97._4_4_ * fVar93 + fVar14 * auVar136._4_4_;
              auVar124._8_4_ = auVar97._8_4_ * fVar94 + fVar15 * auVar136._8_4_;
              auVar124._12_4_ = auVar97._12_4_ * fVar103 + fVar16 * auVar136._12_4_;
              uStack_9d0 = local_9e0;
              uStack_9c8 = uStack_9d8;
              lVar56 = uVar73 + 0x50 + lVar56;
              local_a00 = *(undefined8 *)(lVar56 + 0x10);
              uStack_9f8 = *(undefined8 *)(lVar56 + 0x18);
              auVar136._0_4_ = fVar87 * (float)local_aa0._0_4_ + fVar118 * auVar77._0_4_;
              auVar136._4_4_ = fVar93 * (float)local_aa0._4_4_ + fVar14 * auVar77._4_4_;
              auVar136._8_4_ = fVar94 * fStack_a98 + fVar15 * auVar77._8_4_;
              auVar136._12_4_ = fVar103 * fStack_a94 + fVar16 * auVar77._12_4_;
              auVar79._0_4_ = fVar87 * (float)local_a90._0_4_ + fVar118 * auVar24._0_4_;
              auVar79._4_4_ = fVar93 * (float)local_a90._4_4_ + fVar14 * auVar24._4_4_;
              auVar79._8_4_ = fVar94 * fStack_a88 + fVar15 * auVar24._8_4_;
              auVar79._12_4_ = fVar103 * fStack_a84 + fVar16 * auVar24._12_4_;
              uStack_9f0 = local_a00;
              uStack_9e8 = uStack_9f8;
              auVar156._16_16_ = auVar155;
              auVar156._0_16_ = auVar155;
              auVar101._16_16_ = auVar100;
              auVar101._0_16_ = auVar100;
              auVar215._16_16_ = auVar214;
              auVar215._0_16_ = auVar214;
              auVar125._16_16_ = auVar124;
              auVar125._0_16_ = auVar124;
              auVar137._16_16_ = auVar136;
              auVar137._0_16_ = auVar136;
              auVar169._16_16_ = auVar79;
              auVar169._0_16_ = auVar79;
              uVar72 = *(undefined4 *)&(ray->org).field_0;
              auVar184._4_4_ = uVar72;
              auVar184._0_4_ = uVar72;
              auVar184._8_4_ = uVar72;
              auVar184._12_4_ = uVar72;
              auVar184._16_4_ = uVar72;
              auVar184._20_4_ = uVar72;
              auVar184._24_4_ = uVar72;
              auVar184._28_4_ = uVar72;
              uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar187._4_4_ = uVar3;
              auVar187._0_4_ = uVar3;
              auVar187._8_4_ = uVar3;
              auVar187._12_4_ = uVar3;
              auVar187._16_4_ = uVar3;
              auVar187._20_4_ = uVar3;
              auVar187._24_4_ = uVar3;
              auVar187._28_4_ = uVar3;
              uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar197._4_4_ = uVar3;
              auVar197._0_4_ = uVar3;
              auVar197._8_4_ = uVar3;
              auVar197._12_4_ = uVar3;
              auVar197._16_4_ = uVar3;
              auVar197._20_4_ = uVar3;
              auVar197._24_4_ = uVar3;
              auVar197._28_4_ = uVar3;
              local_ae0 = vsubps_avx(auVar91,auVar184);
              local_b00 = vsubps_avx(auVar113,auVar187);
              local_b20 = vsubps_avx(auVar151,auVar197);
              auVar80 = vsubps_avx(auVar156,auVar184);
              auVar183 = vsubps_avx(auVar101,auVar187);
              auVar17 = vsubps_avx(auVar215,auVar197);
              auVar91 = vsubps_avx(auVar125,auVar184);
              auVar18 = vsubps_avx(auVar137,auVar187);
              auVar19 = vsubps_avx(auVar169,auVar197);
              local_b40 = vsubps_avx(auVar91,local_ae0);
              local_b60 = vsubps_avx(auVar18,local_b00);
              _local_ba0 = vsubps_avx(auVar19,local_b20);
              fVar14 = local_b00._0_4_;
              fVar118 = auVar18._0_4_ + fVar14;
              fVar16 = local_b00._4_4_;
              fVar128 = auVar18._4_4_ + fVar16;
              fVar93 = local_b00._8_4_;
              fVar129 = auVar18._8_4_ + fVar93;
              fVar103 = local_b00._12_4_;
              fVar130 = auVar18._12_4_ + fVar103;
              fVar105 = local_b00._16_4_;
              fVar131 = auVar18._16_4_ + fVar105;
              fVar107 = local_b00._20_4_;
              fVar132 = auVar18._20_4_ + fVar107;
              fVar12 = local_b00._24_4_;
              fVar133 = auVar18._24_4_ + fVar12;
              fVar88 = local_b00._28_4_;
              fVar217 = local_b20._0_4_;
              fVar134 = fVar217 + auVar19._0_4_;
              fVar220 = local_b20._4_4_;
              fVar139 = fVar220 + auVar19._4_4_;
              fVar222 = local_b20._8_4_;
              fVar141 = fVar222 + auVar19._8_4_;
              fVar224 = local_b20._12_4_;
              fVar143 = fVar224 + auVar19._12_4_;
              fVar226 = local_b20._16_4_;
              fVar145 = fVar226 + auVar19._16_4_;
              fVar228 = local_b20._20_4_;
              fVar147 = fVar228 + auVar19._20_4_;
              fVar230 = local_b20._24_4_;
              fVar149 = fVar230 + auVar19._24_4_;
              fVar117 = local_b20._28_4_;
              fVar76 = local_ba0._0_4_;
              fVar81 = local_ba0._4_4_;
              auVar20._4_4_ = fVar81 * fVar128;
              auVar20._0_4_ = fVar76 * fVar118;
              fVar82 = local_ba0._8_4_;
              auVar20._8_4_ = fVar82 * fVar129;
              fVar83 = local_ba0._12_4_;
              auVar20._12_4_ = fVar83 * fVar130;
              fVar84 = local_ba0._16_4_;
              auVar20._16_4_ = fVar84 * fVar131;
              fVar85 = local_ba0._20_4_;
              auVar20._20_4_ = fVar85 * fVar132;
              fVar86 = local_ba0._24_4_;
              auVar20._24_4_ = fVar86 * fVar133;
              auVar20._28_4_ = auVar155._12_4_;
              fVar195 = local_b60._0_4_;
              fVar199 = local_b60._4_4_;
              auVar21._4_4_ = fVar199 * fVar139;
              auVar21._0_4_ = fVar195 * fVar134;
              fVar201 = local_b60._8_4_;
              auVar21._8_4_ = fVar201 * fVar141;
              fVar203 = local_b60._12_4_;
              auVar21._12_4_ = fVar203 * fVar143;
              fVar205 = local_b60._16_4_;
              auVar21._16_4_ = fVar205 * fVar145;
              fVar207 = local_b60._20_4_;
              auVar21._20_4_ = fVar207 * fVar147;
              fVar209 = local_b60._24_4_;
              auVar21._24_4_ = fVar209 * fVar149;
              auVar21._28_4_ = auVar79._12_4_;
              auVar20 = vsubps_avx(auVar21,auVar20);
              fVar15 = local_ae0._0_4_;
              fVar154 = auVar91._0_4_ + fVar15;
              fVar87 = local_ae0._4_4_;
              fVar159 = auVar91._4_4_ + fVar87;
              fVar94 = local_ae0._8_4_;
              fVar160 = auVar91._8_4_ + fVar94;
              fVar104 = local_ae0._12_4_;
              fVar161 = auVar91._12_4_ + fVar104;
              fVar106 = local_ae0._16_4_;
              fVar162 = auVar91._16_4_ + fVar106;
              fVar11 = local_ae0._20_4_;
              fVar163 = auVar91._20_4_ + fVar11;
              fVar13 = local_ae0._24_4_;
              fVar164 = auVar91._24_4_ + fVar13;
              fVar186 = local_b40._0_4_;
              fVar189 = local_b40._4_4_;
              auVar22._4_4_ = fVar189 * fVar139;
              auVar22._0_4_ = fVar186 * fVar134;
              fVar190 = local_b40._8_4_;
              auVar22._8_4_ = fVar190 * fVar141;
              fVar191 = local_b40._12_4_;
              auVar22._12_4_ = fVar191 * fVar143;
              fVar192 = local_b40._16_4_;
              auVar22._16_4_ = fVar192 * fVar145;
              fVar193 = local_b40._20_4_;
              auVar22._20_4_ = fVar193 * fVar147;
              fVar194 = local_b40._24_4_;
              auVar22._24_4_ = fVar194 * fVar149;
              auVar22._28_4_ = fVar117 + auVar19._28_4_;
              auVar23._4_4_ = fVar81 * fVar159;
              auVar23._0_4_ = fVar76 * fVar154;
              auVar23._8_4_ = fVar82 * fVar160;
              auVar23._12_4_ = fVar83 * fVar161;
              auVar23._16_4_ = fVar84 * fVar162;
              auVar23._20_4_ = fVar85 * fVar163;
              auVar23._24_4_ = fVar86 * fVar164;
              auVar23._28_4_ = uVar72;
              auVar21 = vsubps_avx(auVar23,auVar22);
              auVar25._4_4_ = fVar199 * fVar159;
              auVar25._0_4_ = fVar195 * fVar154;
              auVar25._8_4_ = fVar201 * fVar160;
              auVar25._12_4_ = fVar203 * fVar161;
              auVar25._16_4_ = fVar205 * fVar162;
              auVar25._20_4_ = fVar207 * fVar163;
              auVar25._24_4_ = fVar209 * fVar164;
              auVar25._28_4_ = auVar91._28_4_ + local_ae0._28_4_;
              auVar26._4_4_ = fVar189 * fVar128;
              auVar26._0_4_ = fVar186 * fVar118;
              auVar26._8_4_ = fVar190 * fVar129;
              auVar26._12_4_ = fVar191 * fVar130;
              auVar26._16_4_ = fVar192 * fVar131;
              auVar26._20_4_ = fVar193 * fVar132;
              auVar26._24_4_ = fVar194 * fVar133;
              auVar26._28_4_ = auVar18._28_4_ + fVar88;
              auVar22 = vsubps_avx(auVar26,auVar25);
              fStack_d3c = (ray->dir).field_0.m128[1];
              fVar118 = (ray->dir).field_0.m128[2];
              local_b80._4_4_ = fVar118;
              local_b80._0_4_ = fVar118;
              local_b80._8_4_ = fVar118;
              local_b80._12_4_ = fVar118;
              local_b80._16_4_ = fVar118;
              local_b80._20_4_ = fVar118;
              local_b80._24_4_ = fVar118;
              local_b80._28_4_ = fVar118;
              fStack_c7c = (ray->dir).field_0.m128[0];
              local_be0._0_4_ =
                   auVar20._0_4_ * fStack_c7c + fStack_d3c * auVar21._0_4_ + fVar118 * auVar22._0_4_
              ;
              local_be0._4_4_ =
                   auVar20._4_4_ * fStack_c7c + fStack_d3c * auVar21._4_4_ + fVar118 * auVar22._4_4_
              ;
              local_be0._8_4_ =
                   auVar20._8_4_ * fStack_c7c + fStack_d3c * auVar21._8_4_ + fVar118 * auVar22._8_4_
              ;
              local_be0._12_4_ =
                   auVar20._12_4_ * fStack_c7c +
                   fStack_d3c * auVar21._12_4_ + fVar118 * auVar22._12_4_;
              local_be0._16_4_ =
                   auVar20._16_4_ * fStack_c7c +
                   fStack_d3c * auVar21._16_4_ + fVar118 * auVar22._16_4_;
              local_be0._20_4_ =
                   auVar20._20_4_ * fStack_c7c +
                   fStack_d3c * auVar21._20_4_ + fVar118 * auVar22._20_4_;
              local_be0._24_4_ =
                   auVar20._24_4_ * fStack_c7c +
                   fStack_d3c * auVar21._24_4_ + fVar118 * auVar22._24_4_;
              local_be0._28_4_ = auVar21._28_4_ + auVar21._28_4_ + auVar22._28_4_;
              auVar20 = vsubps_avx(local_b00,auVar183);
              _local_bc0 = vsubps_avx(local_b20,auVar17);
              fVar128 = auVar183._0_4_ + fVar14;
              fVar129 = auVar183._4_4_ + fVar16;
              fVar130 = auVar183._8_4_ + fVar93;
              fVar131 = auVar183._12_4_ + fVar103;
              fVar132 = auVar183._16_4_ + fVar105;
              fVar133 = auVar183._20_4_ + fVar107;
              fVar134 = auVar183._24_4_ + fVar12;
              fVar167 = auVar183._28_4_;
              fVar139 = fVar217 + auVar17._0_4_;
              fVar141 = fVar220 + auVar17._4_4_;
              fVar143 = fVar222 + auVar17._8_4_;
              fVar145 = fVar224 + auVar17._12_4_;
              fVar147 = fVar226 + auVar17._16_4_;
              fVar149 = fVar228 + auVar17._20_4_;
              fVar154 = fVar230 + auVar17._24_4_;
              fVar196 = local_bc0._0_4_;
              fVar200 = local_bc0._4_4_;
              auVar27._4_4_ = fVar200 * fVar129;
              auVar27._0_4_ = fVar196 * fVar128;
              fVar202 = local_bc0._8_4_;
              auVar27._8_4_ = fVar202 * fVar130;
              fVar204 = local_bc0._12_4_;
              auVar27._12_4_ = fVar204 * fVar131;
              fVar206 = local_bc0._16_4_;
              auVar27._16_4_ = fVar206 * fVar132;
              fVar208 = local_bc0._20_4_;
              auVar27._20_4_ = fVar208 * fVar133;
              fVar210 = local_bc0._24_4_;
              auVar27._24_4_ = fVar210 * fVar134;
              auVar27._28_4_ = fVar117;
              fVar168 = auVar20._0_4_;
              fVar171 = auVar20._4_4_;
              auVar28._4_4_ = fVar171 * fVar141;
              auVar28._0_4_ = fVar168 * fVar139;
              fVar173 = auVar20._8_4_;
              auVar28._8_4_ = fVar173 * fVar143;
              fVar175 = auVar20._12_4_;
              auVar28._12_4_ = fVar175 * fVar145;
              fVar177 = auVar20._16_4_;
              auVar28._16_4_ = fVar177 * fVar147;
              fVar179 = auVar20._20_4_;
              auVar28._20_4_ = fVar179 * fVar149;
              fVar181 = auVar20._24_4_;
              auVar28._24_4_ = fVar181 * fVar154;
              auVar28._28_4_ = fVar88;
              auVar21 = vsubps_avx(auVar28,auVar27);
              auVar22 = vsubps_avx(local_ae0,auVar80);
              fVar218 = auVar22._0_4_;
              fVar221 = auVar22._4_4_;
              auVar29._4_4_ = fVar221 * fVar141;
              auVar29._0_4_ = fVar218 * fVar139;
              fVar223 = auVar22._8_4_;
              auVar29._8_4_ = fVar223 * fVar143;
              fVar225 = auVar22._12_4_;
              auVar29._12_4_ = fVar225 * fVar145;
              fVar227 = auVar22._16_4_;
              auVar29._16_4_ = fVar227 * fVar147;
              fVar229 = auVar22._20_4_;
              auVar29._20_4_ = fVar229 * fVar149;
              fVar231 = auVar22._24_4_;
              auVar29._24_4_ = fVar231 * fVar154;
              auVar29._28_4_ = fVar117 + auVar17._28_4_;
              fVar139 = auVar80._0_4_ + fVar15;
              fVar141 = auVar80._4_4_ + fVar87;
              fVar143 = auVar80._8_4_ + fVar94;
              fVar145 = auVar80._12_4_ + fVar104;
              fVar147 = auVar80._16_4_ + fVar106;
              fVar149 = auVar80._20_4_ + fVar11;
              fVar154 = auVar80._24_4_ + fVar13;
              fVar165 = auVar80._28_4_ + local_ae0._28_4_;
              auVar30._4_4_ = fVar200 * fVar141;
              auVar30._0_4_ = fVar196 * fVar139;
              auVar30._8_4_ = fVar202 * fVar143;
              auVar30._12_4_ = fVar204 * fVar145;
              auVar30._16_4_ = fVar206 * fVar147;
              auVar30._20_4_ = fVar208 * fVar149;
              auVar30._24_4_ = fVar210 * fVar154;
              auVar30._28_4_ = local_bc0._28_4_;
              auVar22 = vsubps_avx(auVar30,auVar29);
              auVar31._4_4_ = fVar171 * fVar141;
              auVar31._0_4_ = fVar168 * fVar139;
              auVar31._8_4_ = fVar173 * fVar143;
              auVar31._12_4_ = fVar175 * fVar145;
              auVar31._16_4_ = fVar177 * fVar147;
              auVar31._20_4_ = fVar179 * fVar149;
              auVar31._24_4_ = fVar181 * fVar154;
              auVar31._28_4_ = fVar165;
              auVar32._4_4_ = fVar221 * fVar129;
              auVar32._0_4_ = fVar218 * fVar128;
              auVar32._8_4_ = fVar223 * fVar130;
              auVar32._12_4_ = fVar225 * fVar131;
              auVar32._16_4_ = fVar227 * fVar132;
              auVar32._20_4_ = fVar229 * fVar133;
              auVar32._24_4_ = fVar231 * fVar134;
              auVar32._28_4_ = fVar167 + fVar88;
              auVar23 = vsubps_avx(auVar32,auVar31);
              local_c00._0_4_ =
                   fStack_c7c * auVar21._0_4_ + fStack_d3c * auVar22._0_4_ + fVar118 * auVar23._0_4_
              ;
              local_c00._4_4_ =
                   fStack_c7c * auVar21._4_4_ + fStack_d3c * auVar22._4_4_ + fVar118 * auVar23._4_4_
              ;
              fStack_bf8 = fStack_c7c * auVar21._8_4_ +
                           fStack_d3c * auVar22._8_4_ + fVar118 * auVar23._8_4_;
              fStack_bf4 = fStack_c7c * auVar21._12_4_ +
                           fStack_d3c * auVar22._12_4_ + fVar118 * auVar23._12_4_;
              register0x00001310 =
                   fStack_c7c * auVar21._16_4_ +
                   fStack_d3c * auVar22._16_4_ + fVar118 * auVar23._16_4_;
              register0x00001314 =
                   fStack_c7c * auVar21._20_4_ +
                   fStack_d3c * auVar22._20_4_ + fVar118 * auVar23._20_4_;
              register0x00001318 =
                   fStack_c7c * auVar21._24_4_ +
                   fStack_d3c * auVar22._24_4_ + fVar118 * auVar23._24_4_;
              register0x0000131c = auVar21._28_4_ + auVar22._28_4_ + auVar23._28_4_;
              auVar21 = vsubps_avx(auVar80,auVar91);
              fVar134 = auVar80._0_4_ + auVar91._0_4_;
              fVar139 = auVar80._4_4_ + auVar91._4_4_;
              fVar141 = auVar80._8_4_ + auVar91._8_4_;
              fVar143 = auVar80._12_4_ + auVar91._12_4_;
              fVar145 = auVar80._16_4_ + auVar91._16_4_;
              fVar147 = auVar80._20_4_ + auVar91._20_4_;
              fVar149 = auVar80._24_4_ + auVar91._24_4_;
              fVar154 = auVar80._28_4_ + auVar91._28_4_;
              auVar80 = vsubps_avx(auVar183,auVar18);
              fVar88 = auVar183._0_4_ + auVar18._0_4_;
              fVar128 = auVar183._4_4_ + auVar18._4_4_;
              fVar129 = auVar183._8_4_ + auVar18._8_4_;
              fVar130 = auVar183._12_4_ + auVar18._12_4_;
              fVar131 = auVar183._16_4_ + auVar18._16_4_;
              fVar132 = auVar183._20_4_ + auVar18._20_4_;
              fVar133 = auVar183._24_4_ + auVar18._24_4_;
              auVar91 = vsubps_avx(auVar17,auVar19);
              fVar159 = auVar17._0_4_ + auVar19._0_4_;
              fVar160 = auVar17._4_4_ + auVar19._4_4_;
              fVar161 = auVar17._8_4_ + auVar19._8_4_;
              fVar162 = auVar17._12_4_ + auVar19._12_4_;
              fVar163 = auVar17._16_4_ + auVar19._16_4_;
              fVar164 = auVar17._20_4_ + auVar19._20_4_;
              fVar117 = auVar17._24_4_ + auVar19._24_4_;
              fVar135 = auVar91._0_4_;
              fVar140 = auVar91._4_4_;
              auVar33._4_4_ = fVar140 * fVar128;
              auVar33._0_4_ = fVar135 * fVar88;
              fVar142 = auVar91._8_4_;
              auVar33._8_4_ = fVar142 * fVar129;
              fVar144 = auVar91._12_4_;
              auVar33._12_4_ = fVar144 * fVar130;
              fVar146 = auVar91._16_4_;
              auVar33._16_4_ = fVar146 * fVar131;
              fVar148 = auVar91._20_4_;
              auVar33._20_4_ = fVar148 * fVar132;
              fVar150 = auVar91._24_4_;
              auVar33._24_4_ = fVar150 * fVar133;
              auVar33._28_4_ = fVar165;
              fVar165 = auVar80._0_4_;
              fVar172 = auVar80._4_4_;
              auVar34._4_4_ = fVar172 * fVar160;
              auVar34._0_4_ = fVar165 * fVar159;
              fVar174 = auVar80._8_4_;
              auVar34._8_4_ = fVar174 * fVar161;
              fVar176 = auVar80._12_4_;
              auVar34._12_4_ = fVar176 * fVar162;
              fVar178 = auVar80._16_4_;
              auVar34._16_4_ = fVar178 * fVar163;
              fVar180 = auVar80._20_4_;
              auVar34._20_4_ = fVar180 * fVar164;
              fVar182 = auVar80._24_4_;
              auVar34._24_4_ = fVar182 * fVar117;
              auVar34._28_4_ = fVar167;
              auVar80 = vsubps_avx(auVar34,auVar33);
              fVar211 = auVar21._0_4_;
              fVar213 = auVar21._4_4_;
              auVar35._4_4_ = fVar213 * fVar160;
              auVar35._0_4_ = fVar211 * fVar159;
              fVar159 = auVar21._8_4_;
              auVar35._8_4_ = fVar159 * fVar161;
              fVar160 = auVar21._12_4_;
              auVar35._12_4_ = fVar160 * fVar162;
              fVar161 = auVar21._16_4_;
              auVar35._16_4_ = fVar161 * fVar163;
              fVar162 = auVar21._20_4_;
              auVar35._20_4_ = fVar162 * fVar164;
              fVar163 = auVar21._24_4_;
              auVar35._24_4_ = fVar163 * fVar117;
              auVar35._28_4_ = auVar17._28_4_ + auVar19._28_4_;
              auVar17._4_4_ = fVar140 * fVar139;
              auVar17._0_4_ = fVar135 * fVar134;
              auVar17._8_4_ = fVar142 * fVar141;
              auVar17._12_4_ = fVar144 * fVar143;
              auVar17._16_4_ = fVar146 * fVar145;
              auVar17._20_4_ = fVar148 * fVar147;
              auVar17._24_4_ = fVar150 * fVar149;
              auVar17._28_4_ = fVar167;
              auVar183 = vsubps_avx(auVar17,auVar35);
              auVar19._4_4_ = fVar172 * fVar139;
              auVar19._0_4_ = fVar165 * fVar134;
              auVar19._8_4_ = fVar174 * fVar141;
              auVar19._12_4_ = fVar176 * fVar143;
              auVar19._16_4_ = fVar178 * fVar145;
              auVar19._20_4_ = fVar180 * fVar147;
              auVar19._24_4_ = fVar182 * fVar149;
              auVar19._28_4_ = fVar154;
              auVar36._4_4_ = fVar213 * fVar128;
              auVar36._0_4_ = fVar211 * fVar88;
              auVar36._8_4_ = fVar159 * fVar129;
              auVar36._12_4_ = fVar160 * fVar130;
              auVar36._16_4_ = fVar161 * fVar131;
              auVar36._20_4_ = fVar162 * fVar132;
              auVar36._24_4_ = fVar163 * fVar133;
              auVar36._28_4_ = fVar167 + auVar18._28_4_;
              auVar17 = vsubps_avx(auVar36,auVar19);
              local_d40 = fStack_d3c;
              fStack_d38 = fStack_d3c;
              fStack_d34 = fStack_d3c;
              fStack_d30 = fStack_d3c;
              fStack_d2c = fStack_d3c;
              fStack_d28 = fStack_d3c;
              fStack_d24 = fStack_d3c;
              local_c80 = fStack_c7c;
              fStack_c78 = fStack_c7c;
              fStack_c74 = fStack_c7c;
              fStack_c70 = fStack_c7c;
              fStack_c6c = fStack_c7c;
              fStack_c68 = fStack_c7c;
              fStack_c64 = fStack_c7c;
              auVar92._0_4_ =
                   fStack_c7c * auVar80._0_4_ +
                   fStack_d3c * auVar183._0_4_ + fVar118 * auVar17._0_4_;
              auVar92._4_4_ =
                   fStack_c7c * auVar80._4_4_ +
                   fStack_d3c * auVar183._4_4_ + fVar118 * auVar17._4_4_;
              auVar92._8_4_ =
                   fStack_c7c * auVar80._8_4_ +
                   fStack_d3c * auVar183._8_4_ + fVar118 * auVar17._8_4_;
              auVar92._12_4_ =
                   fStack_c7c * auVar80._12_4_ +
                   fStack_d3c * auVar183._12_4_ + fVar118 * auVar17._12_4_;
              auVar92._16_4_ =
                   fStack_c7c * auVar80._16_4_ +
                   fStack_d3c * auVar183._16_4_ + fVar118 * auVar17._16_4_;
              auVar92._20_4_ =
                   fStack_c7c * auVar80._20_4_ +
                   fStack_d3c * auVar183._20_4_ + fVar118 * auVar17._20_4_;
              auVar92._24_4_ =
                   fStack_c7c * auVar80._24_4_ +
                   fStack_d3c * auVar183._24_4_ + fVar118 * auVar17._24_4_;
              auVar92._28_4_ = fVar154 + fVar154 + auVar17._28_4_;
              local_c40._0_4_ = auVar92._0_4_ + local_be0._0_4_ + (float)local_c00._0_4_;
              local_c40._4_4_ = auVar92._4_4_ + local_be0._4_4_ + (float)local_c00._4_4_;
              fStack_c38 = auVar92._8_4_ + local_be0._8_4_ + fStack_bf8;
              fStack_c34 = auVar92._12_4_ + local_be0._12_4_ + fStack_bf4;
              register0x00001210 = auVar92._16_4_ + local_be0._16_4_ + register0x00001310;
              register0x00001214 = auVar92._20_4_ + local_be0._20_4_ + register0x00001314;
              register0x00001218 = auVar92._24_4_ + local_be0._24_4_ + register0x00001318;
              register0x0000121c = auVar92._28_4_ + local_be0._28_4_ + register0x0000131c;
              auVar80 = vminps_avx(local_be0,_local_c00);
              auVar80 = vminps_avx(auVar80,auVar92);
              auVar114._8_4_ = 0x7fffffff;
              auVar114._0_8_ = 0x7fffffff7fffffff;
              auVar114._12_4_ = 0x7fffffff;
              auVar114._16_4_ = 0x7fffffff;
              auVar114._20_4_ = 0x7fffffff;
              auVar114._24_4_ = 0x7fffffff;
              auVar114._28_4_ = 0x7fffffff;
              _local_c20 = vandps_avx(_local_c40,auVar114);
              fVar88 = local_c20._0_4_ * 1.1920929e-07;
              fVar128 = local_c20._4_4_ * 1.1920929e-07;
              auVar18._4_4_ = fVar128;
              auVar18._0_4_ = fVar88;
              fVar129 = local_c20._8_4_ * 1.1920929e-07;
              auVar18._8_4_ = fVar129;
              fVar130 = local_c20._12_4_ * 1.1920929e-07;
              auVar18._12_4_ = fVar130;
              fVar131 = local_c20._16_4_ * 1.1920929e-07;
              auVar18._16_4_ = fVar131;
              fVar132 = local_c20._20_4_ * 1.1920929e-07;
              auVar18._20_4_ = fVar132;
              fVar133 = local_c20._24_4_ * 1.1920929e-07;
              auVar18._24_4_ = fVar133;
              auVar18._28_4_ = 0x34000000;
              auVar157._0_8_ = CONCAT44(fVar128,fVar88) ^ 0x8000000080000000;
              auVar157._8_4_ = -fVar129;
              auVar157._12_4_ = -fVar130;
              auVar157._16_4_ = -fVar131;
              auVar157._20_4_ = -fVar132;
              auVar157._24_4_ = -fVar133;
              auVar157._28_4_ = 0xb4000000;
              auVar80 = vcmpps_avx(auVar80,auVar157,5);
              auVar17 = vmaxps_avx(local_be0,_local_c00);
              auVar183 = vmaxps_avx(auVar17,auVar92);
              auVar183 = vcmpps_avx(auVar183,auVar18,2);
              local_c60 = vorps_avx(auVar80,auVar183);
              if ((((((((local_c60 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (local_c60 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (local_c60 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(local_c60 >> 0x7f,0) == '\0') &&
                    (local_c60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(local_c60 >> 0xbf,0) == '\0') &&
                  (local_c60 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < local_c60[0x1f]) {
LAB_002e05a6:
                auVar158 = ZEXT1664(local_d50);
                auVar166 = ZEXT1664(local_d60);
                auVar170 = ZEXT1664(local_d70);
                auVar188 = ZEXT1664(local_d80);
                auVar198 = ZEXT1664(local_d90);
                auVar212 = ZEXT1664(local_da0);
                auVar216 = ZEXT1664(local_db0);
                auVar138 = ZEXT1664(local_dc0);
                auVar219 = ZEXT1664(local_dd0);
              }
              else {
                auVar37._4_4_ = fVar171 * fVar81;
                auVar37._0_4_ = fVar168 * fVar76;
                auVar37._8_4_ = fVar173 * fVar82;
                auVar37._12_4_ = fVar175 * fVar83;
                auVar37._16_4_ = fVar177 * fVar84;
                auVar37._20_4_ = fVar179 * fVar85;
                auVar37._24_4_ = fVar181 * fVar86;
                auVar37._28_4_ = auVar80._28_4_;
                auVar38._4_4_ = fVar200 * fVar199;
                auVar38._0_4_ = fVar196 * fVar195;
                auVar38._8_4_ = fVar202 * fVar201;
                auVar38._12_4_ = fVar204 * fVar203;
                auVar38._16_4_ = fVar206 * fVar205;
                auVar38._20_4_ = fVar208 * fVar207;
                auVar38._24_4_ = fVar210 * fVar209;
                auVar38._28_4_ = 0x34000000;
                auVar18 = vsubps_avx(auVar38,auVar37);
                auVar39._4_4_ = fVar200 * fVar172;
                auVar39._0_4_ = fVar196 * fVar165;
                auVar39._8_4_ = fVar202 * fVar174;
                auVar39._12_4_ = fVar204 * fVar176;
                auVar39._16_4_ = fVar206 * fVar178;
                auVar39._20_4_ = fVar208 * fVar180;
                auVar39._24_4_ = fVar210 * fVar182;
                auVar39._28_4_ = auVar17._28_4_;
                auVar40._4_4_ = fVar171 * fVar140;
                auVar40._0_4_ = fVar168 * fVar135;
                auVar40._8_4_ = fVar173 * fVar142;
                auVar40._12_4_ = fVar175 * fVar144;
                auVar40._16_4_ = fVar177 * fVar146;
                auVar40._20_4_ = fVar179 * fVar148;
                auVar40._24_4_ = fVar181 * fVar150;
                auVar40._28_4_ = auVar20._28_4_;
                auVar17 = vsubps_avx(auVar40,auVar39);
                auVar126._8_4_ = 0x7fffffff;
                auVar126._0_8_ = 0x7fffffff7fffffff;
                auVar126._12_4_ = 0x7fffffff;
                auVar126._16_4_ = 0x7fffffff;
                auVar126._20_4_ = 0x7fffffff;
                auVar126._24_4_ = 0x7fffffff;
                auVar126._28_4_ = 0x7fffffff;
                auVar80 = vandps_avx(auVar37,auVar126);
                auVar183 = vandps_avx(auVar39,auVar126);
                auVar80 = vcmpps_avx(auVar80,auVar183,1);
                local_960 = vblendvps_avx(auVar17,auVar18,auVar80);
                auVar41._4_4_ = fVar221 * fVar140;
                auVar41._0_4_ = fVar218 * fVar135;
                auVar41._8_4_ = fVar223 * fVar142;
                auVar41._12_4_ = fVar225 * fVar144;
                auVar41._16_4_ = fVar227 * fVar146;
                auVar41._20_4_ = fVar229 * fVar148;
                auVar41._24_4_ = fVar231 * fVar150;
                auVar41._28_4_ = auVar80._28_4_;
                auVar42._4_4_ = fVar221 * fVar81;
                auVar42._0_4_ = fVar218 * fVar76;
                auVar42._8_4_ = fVar223 * fVar82;
                auVar42._12_4_ = fVar225 * fVar83;
                auVar42._16_4_ = fVar227 * fVar84;
                auVar42._20_4_ = fVar229 * fVar85;
                auVar42._24_4_ = fVar231 * fVar86;
                auVar42._28_4_ = auVar18._28_4_;
                auVar43._4_4_ = fVar189 * fVar200;
                auVar43._0_4_ = fVar186 * fVar196;
                auVar43._8_4_ = fVar190 * fVar202;
                auVar43._12_4_ = fVar191 * fVar204;
                auVar43._16_4_ = fVar192 * fVar206;
                auVar43._20_4_ = fVar193 * fVar208;
                auVar43._24_4_ = fVar194 * fVar210;
                auVar43._28_4_ = fVar118;
                auVar17 = vsubps_avx(auVar42,auVar43);
                auVar44._4_4_ = fVar200 * fVar213;
                auVar44._0_4_ = fVar196 * fVar211;
                auVar44._8_4_ = fVar202 * fVar159;
                auVar44._12_4_ = fVar204 * fVar160;
                auVar44._16_4_ = fVar206 * fVar161;
                auVar44._20_4_ = fVar208 * fVar162;
                auVar44._24_4_ = fVar210 * fVar163;
                auVar44._28_4_ = auVar183._28_4_;
                auVar18 = vsubps_avx(auVar44,auVar41);
                auVar80 = vandps_avx(auVar43,auVar126);
                auVar183 = vandps_avx(auVar41,auVar126);
                auVar80 = vcmpps_avx(auVar80,auVar183,1);
                local_940 = vblendvps_avx(auVar18,auVar17,auVar80);
                auVar45._4_4_ = fVar171 * fVar213;
                auVar45._0_4_ = fVar168 * fVar211;
                auVar45._8_4_ = fVar173 * fVar159;
                auVar45._12_4_ = fVar175 * fVar160;
                auVar45._16_4_ = fVar177 * fVar161;
                auVar45._20_4_ = fVar179 * fVar162;
                auVar45._24_4_ = fVar181 * fVar163;
                auVar45._28_4_ = auVar80._28_4_;
                auVar46._4_4_ = fVar189 * fVar171;
                auVar46._0_4_ = fVar186 * fVar168;
                auVar46._8_4_ = fVar190 * fVar173;
                auVar46._12_4_ = fVar191 * fVar175;
                auVar46._16_4_ = fVar192 * fVar177;
                auVar46._20_4_ = fVar193 * fVar179;
                auVar46._24_4_ = fVar194 * fVar181;
                auVar46._28_4_ = auVar17._28_4_;
                auVar47._4_4_ = fVar221 * fVar199;
                auVar47._0_4_ = fVar218 * fVar195;
                auVar47._8_4_ = fVar223 * fVar201;
                auVar47._12_4_ = fVar225 * fVar203;
                auVar47._16_4_ = fVar227 * fVar205;
                auVar47._20_4_ = fVar229 * fVar207;
                auVar47._24_4_ = fVar231 * fVar209;
                auVar47._28_4_ = auVar91._28_4_;
                auVar48._4_4_ = fVar221 * fVar172;
                auVar48._0_4_ = fVar218 * fVar165;
                auVar48._8_4_ = fVar223 * fVar174;
                auVar48._12_4_ = fVar225 * fVar176;
                auVar48._16_4_ = fVar227 * fVar178;
                auVar48._20_4_ = fVar229 * fVar180;
                auVar48._24_4_ = fVar231 * fVar182;
                auVar48._28_4_ = uStack_b84;
                auVar17 = vsubps_avx(auVar46,auVar47);
                auVar91 = vsubps_avx(auVar48,auVar45);
                auVar80 = vandps_avx(auVar47,auVar126);
                auVar183 = vandps_avx(auVar45,auVar126);
                auVar183 = vcmpps_avx(auVar80,auVar183,1);
                local_920 = vblendvps_avx(auVar91,auVar17,auVar183);
                auVar78 = vpackssdw_avx(local_c60._0_16_,local_c60._16_16_);
                fVar76 = local_920._0_4_;
                fVar81 = local_920._4_4_;
                fVar82 = local_920._8_4_;
                fVar83 = local_920._12_4_;
                fVar84 = local_920._16_4_;
                fVar85 = local_920._20_4_;
                fVar86 = local_920._24_4_;
                fVar134 = local_940._0_4_;
                fVar139 = local_940._4_4_;
                fVar141 = local_940._8_4_;
                fVar143 = local_940._12_4_;
                fVar145 = local_940._16_4_;
                fVar147 = local_940._20_4_;
                fVar149 = local_940._24_4_;
                fVar154 = local_960._0_4_;
                fVar159 = local_960._4_4_;
                fVar160 = local_960._8_4_;
                fVar161 = local_960._12_4_;
                fVar162 = local_960._16_4_;
                fVar163 = local_960._20_4_;
                fVar164 = local_960._24_4_;
                fVar88 = fVar154 * fStack_c7c + fVar134 * fStack_d3c + fVar76 * fVar118;
                fVar128 = fVar159 * fStack_c7c + fVar139 * fStack_d3c + fVar81 * fVar118;
                fVar129 = fVar160 * fStack_c7c + fVar141 * fStack_d3c + fVar82 * fVar118;
                fVar130 = fVar161 * fStack_c7c + fVar143 * fStack_d3c + fVar83 * fVar118;
                fVar131 = fVar162 * fStack_c7c + fVar145 * fStack_d3c + fVar84 * fVar118;
                fVar132 = fVar163 * fStack_c7c + fVar147 * fStack_d3c + fVar85 * fVar118;
                fVar118 = fVar164 * fStack_c7c + fVar149 * fStack_d3c + fVar86 * fVar118;
                fVar133 = auVar17._28_4_ + auVar17._28_4_ + 0.0;
                auVar115._0_4_ = fVar88 + fVar88;
                auVar115._4_4_ = fVar128 + fVar128;
                auVar115._8_4_ = fVar129 + fVar129;
                auVar115._12_4_ = fVar130 + fVar130;
                auVar115._16_4_ = fVar131 + fVar131;
                auVar115._20_4_ = fVar132 + fVar132;
                auVar115._24_4_ = fVar118 + fVar118;
                auVar115._28_4_ = fVar133 + fVar133;
                fVar88 = auVar80._28_4_;
                auVar80 = vrcpps_avx(auVar115);
                fVar128 = fVar154 * fVar15 + fVar134 * fVar14 + fVar76 * fVar217;
                fVar129 = fVar159 * fVar87 + fVar139 * fVar16 + fVar81 * fVar220;
                fVar130 = fVar160 * fVar94 + fVar141 * fVar93 + fVar82 * fVar222;
                fVar103 = fVar161 * fVar104 + fVar143 * fVar103 + fVar83 * fVar224;
                fVar104 = fVar162 * fVar106 + fVar145 * fVar105 + fVar84 * fVar226;
                fVar105 = fVar163 * fVar11 + fVar147 * fVar107 + fVar85 * fVar228;
                fVar106 = fVar164 * fVar13 + fVar149 * fVar12 + fVar86 * fVar230;
                fVar107 = fVar88 + fVar88 + fVar133;
                fVar118 = auVar80._0_4_;
                fVar14 = auVar80._4_4_;
                auVar49._4_4_ = auVar115._4_4_ * fVar14;
                auVar49._0_4_ = auVar115._0_4_ * fVar118;
                fVar15 = auVar80._8_4_;
                auVar49._8_4_ = auVar115._8_4_ * fVar15;
                fVar16 = auVar80._12_4_;
                auVar49._12_4_ = auVar115._12_4_ * fVar16;
                fVar87 = auVar80._16_4_;
                auVar49._16_4_ = auVar115._16_4_ * fVar87;
                fVar93 = auVar80._20_4_;
                auVar49._20_4_ = auVar115._20_4_ * fVar93;
                fVar94 = auVar80._24_4_;
                auVar49._24_4_ = auVar115._24_4_ * fVar94;
                auVar49._28_4_ = fVar88;
                auVar127._8_4_ = 0x3f800000;
                auVar127._0_8_ = &DAT_3f8000003f800000;
                auVar127._12_4_ = 0x3f800000;
                auVar127._16_4_ = 0x3f800000;
                auVar127._20_4_ = 0x3f800000;
                auVar127._24_4_ = 0x3f800000;
                auVar127._28_4_ = 0x3f800000;
                auVar80 = vsubps_avx(auVar127,auVar49);
                uVar72 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar152._4_4_ = uVar72;
                auVar152._0_4_ = uVar72;
                auVar152._8_4_ = uVar72;
                auVar152._12_4_ = uVar72;
                auVar152._16_4_ = uVar72;
                auVar152._20_4_ = uVar72;
                auVar152._24_4_ = uVar72;
                auVar152._28_4_ = uVar72;
                local_8a0._4_4_ = (fVar129 + fVar129) * (fVar14 + fVar14 * auVar80._4_4_);
                local_8a0._0_4_ = (fVar128 + fVar128) * (fVar118 + fVar118 * auVar80._0_4_);
                local_8a0._8_4_ = (fVar130 + fVar130) * (fVar15 + fVar15 * auVar80._8_4_);
                local_8a0._12_4_ = (fVar103 + fVar103) * (fVar16 + fVar16 * auVar80._12_4_);
                local_8a0._16_4_ = (fVar104 + fVar104) * (fVar87 + fVar87 * auVar80._16_4_);
                local_8a0._20_4_ = (fVar105 + fVar105) * (fVar93 + fVar93 * auVar80._20_4_);
                local_8a0._24_4_ = (fVar106 + fVar106) * (fVar94 + fVar94 * auVar80._24_4_);
                local_8a0._28_4_ = fVar107 + fVar107;
                auVar80 = vcmpps_avx(auVar152,local_8a0,2);
                fVar118 = ray->tfar;
                auVar153._4_4_ = fVar118;
                auVar153._0_4_ = fVar118;
                auVar153._8_4_ = fVar118;
                auVar153._12_4_ = fVar118;
                auVar153._16_4_ = fVar118;
                auVar153._20_4_ = fVar118;
                auVar153._24_4_ = fVar118;
                auVar153._28_4_ = fVar118;
                auVar183 = vcmpps_avx(local_8a0,auVar153,2);
                auVar80 = vandps_avx(auVar183,auVar80);
                auVar183 = vcmpps_avx(auVar115,_DAT_02020f00,4);
                auVar80 = vandps_avx(auVar80,auVar183);
                auVar119 = vpackssdw_avx(auVar80._0_16_,auVar80._16_16_);
                auVar78 = vpand_avx(auVar119,auVar78);
                auVar119 = vpmovsxwd_avx(auVar78);
                auVar89 = vpshufd_avx(auVar78,0xee);
                auVar89 = vpmovsxwd_avx(auVar89);
                local_900._16_16_ = auVar89;
                local_900._0_16_ = auVar119;
                if ((((((((local_900 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_900 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_900 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_900 >> 0x7f,0) == '\0') &&
                      (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB161(auVar89 >> 0x3f,0) == '\0') &&
                    (local_900 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar89[0xf]) goto LAB_002e05a6;
                local_9c0 = local_be0._0_4_;
                fStack_9bc = local_be0._4_4_;
                fStack_9b8 = local_be0._8_4_;
                fStack_9b4 = local_be0._12_4_;
                fStack_9b0 = local_be0._16_4_;
                fStack_9ac = local_be0._20_4_;
                fStack_9a8 = local_be0._24_4_;
                fStack_9a4 = local_be0._28_4_;
                local_9a0 = (float)local_c00._0_4_;
                fStack_99c = (float)local_c00._4_4_;
                fStack_998 = fStack_bf8;
                fStack_994 = fStack_bf4;
                fStack_990 = register0x00001310;
                fStack_98c = register0x00001314;
                fStack_988 = register0x00001318;
                fStack_984 = register0x0000131c;
                local_980 = _local_c40;
                local_820 = local_a20;
                auVar80 = vrcpps_avx(_local_c40);
                fVar118 = auVar80._0_4_;
                fVar14 = auVar80._4_4_;
                auVar50._4_4_ = (float)local_c40._4_4_ * fVar14;
                auVar50._0_4_ = (float)local_c40._0_4_ * fVar118;
                fVar15 = auVar80._8_4_;
                auVar50._8_4_ = fStack_c38 * fVar15;
                fVar16 = auVar80._12_4_;
                auVar50._12_4_ = fStack_c34 * fVar16;
                fVar87 = auVar80._16_4_;
                auVar50._16_4_ = register0x00001210 * fVar87;
                fVar93 = auVar80._20_4_;
                auVar50._20_4_ = register0x00001214 * fVar93;
                fVar94 = auVar80._24_4_;
                auVar50._24_4_ = register0x00001218 * fVar94;
                auVar50._28_4_ = auVar89._12_4_;
                auVar185._8_4_ = 0x3f800000;
                auVar185._0_8_ = &DAT_3f8000003f800000;
                auVar185._12_4_ = 0x3f800000;
                auVar185._16_4_ = 0x3f800000;
                auVar185._20_4_ = 0x3f800000;
                auVar185._24_4_ = 0x3f800000;
                auVar185._28_4_ = 0x3f800000;
                auVar183 = vsubps_avx(auVar185,auVar50);
                auVar102._0_4_ = fVar118 + fVar118 * auVar183._0_4_;
                auVar102._4_4_ = fVar14 + fVar14 * auVar183._4_4_;
                auVar102._8_4_ = fVar15 + fVar15 * auVar183._8_4_;
                auVar102._12_4_ = fVar16 + fVar16 * auVar183._12_4_;
                auVar102._16_4_ = fVar87 + fVar87 * auVar183._16_4_;
                auVar102._20_4_ = fVar93 + fVar93 * auVar183._20_4_;
                auVar102._24_4_ = fVar94 + fVar94 * auVar183._24_4_;
                auVar102._28_4_ = auVar80._28_4_ + auVar183._28_4_;
                auVar116._8_4_ = 0x219392ef;
                auVar116._0_8_ = 0x219392ef219392ef;
                auVar116._12_4_ = 0x219392ef;
                auVar116._16_4_ = 0x219392ef;
                auVar116._20_4_ = 0x219392ef;
                auVar116._24_4_ = 0x219392ef;
                auVar116._28_4_ = 0x219392ef;
                auVar183 = vcmpps_avx(_local_c20,auVar116,5);
                auVar80 = vandps_avx(auVar183,auVar102);
                auVar51._4_4_ = local_be0._4_4_ * auVar80._4_4_;
                auVar51._0_4_ = local_be0._0_4_ * auVar80._0_4_;
                auVar51._8_4_ = local_be0._8_4_ * auVar80._8_4_;
                auVar51._12_4_ = local_be0._12_4_ * auVar80._12_4_;
                auVar51._16_4_ = local_be0._16_4_ * auVar80._16_4_;
                auVar51._20_4_ = local_be0._20_4_ * auVar80._20_4_;
                auVar51._24_4_ = local_be0._24_4_ * auVar80._24_4_;
                auVar51._28_4_ = auVar183._28_4_;
                auVar183 = vminps_avx(auVar51,auVar185);
                auVar52._4_4_ = (float)local_c00._4_4_ * auVar80._4_4_;
                auVar52._0_4_ = (float)local_c00._0_4_ * auVar80._0_4_;
                auVar52._8_4_ = fStack_bf8 * auVar80._8_4_;
                auVar52._12_4_ = fStack_bf4 * auVar80._12_4_;
                auVar52._16_4_ = register0x00001310 * auVar80._16_4_;
                auVar52._20_4_ = register0x00001314 * auVar80._20_4_;
                auVar52._24_4_ = register0x00001318 * auVar80._24_4_;
                auVar52._28_4_ = auVar80._28_4_;
                auVar80 = vminps_avx(auVar52,auVar185);
                auVar17 = vsubps_avx(auVar185,auVar183);
                auVar91 = vsubps_avx(auVar185,auVar80);
                local_8c0 = vblendvps_avx(auVar80,auVar17,local_a20);
                local_8e0 = vblendvps_avx(auVar183,auVar91,local_a20);
                fVar118 = local_a40._0_4_;
                fVar14 = local_a40._4_4_;
                local_880._4_4_ = fVar159 * fVar14;
                local_880._0_4_ = fVar154 * fVar118;
                fVar15 = local_a40._8_4_;
                local_880._8_4_ = fVar160 * fVar15;
                fVar16 = local_a40._12_4_;
                local_880._12_4_ = fVar161 * fVar16;
                fVar87 = local_a40._16_4_;
                local_880._16_4_ = fVar162 * fVar87;
                fVar93 = local_a40._20_4_;
                local_880._20_4_ = fVar163 * fVar93;
                fVar94 = local_a40._24_4_;
                local_880._24_4_ = fVar164 * fVar94;
                local_880._28_4_ = local_8c0._28_4_;
                local_860._4_4_ = fVar139 * fVar14;
                local_860._0_4_ = fVar134 * fVar118;
                local_860._8_4_ = fVar141 * fVar15;
                local_860._12_4_ = fVar143 * fVar16;
                local_860._16_4_ = fVar145 * fVar87;
                local_860._20_4_ = fVar147 * fVar93;
                local_860._24_4_ = fVar149 * fVar94;
                local_860._28_4_ = local_8e0._28_4_;
                local_840[0] = fVar118 * fVar76;
                local_840[1] = fVar14 * fVar81;
                local_840[2] = fVar15 * fVar82;
                local_840[3] = fVar16 * fVar83;
                fStack_830 = fVar87 * fVar84;
                fStack_82c = fVar93 * fVar85;
                fStack_828 = fVar94 * fVar86;
                uStack_824 = local_920._28_4_;
                auVar78 = vpsllw_avx(auVar78,0xf);
                auVar78 = vpacksswb_avx(auVar78,auVar78);
                uVar59 = (ulong)(byte)(SUB161(auVar78 >> 7,0) & 1 |
                                       (SUB161(auVar78 >> 0xf,0) & 1) << 1 |
                                       (SUB161(auVar78 >> 0x17,0) & 1) << 2 |
                                       (SUB161(auVar78 >> 0x1f,0) & 1) << 3 |
                                       (SUB161(auVar78 >> 0x27,0) & 1) << 4 |
                                       (SUB161(auVar78 >> 0x2f,0) & 1) << 5 |
                                       (SUB161(auVar78 >> 0x37,0) & 1) << 6 |
                                      SUB161(auVar78 >> 0x3f,0) << 7);
                auVar158 = ZEXT1664(local_d50);
                auVar166 = ZEXT1664(local_d60);
                auVar170 = ZEXT1664(local_d70);
                auVar188 = ZEXT1664(local_d80);
                auVar198 = ZEXT1664(local_d90);
                auVar212 = ZEXT1664(local_da0);
                auVar216 = ZEXT1664(local_db0);
                auVar138 = ZEXT1664(local_dc0);
                auVar219 = ZEXT1664(local_dd0);
                do {
                  uVar62 = 0;
                  if (uVar59 != 0) {
                    for (; (uVar59 >> uVar62 & 1) == 0; uVar62 = uVar62 + 1) {
                    }
                  }
                  local_cc8 = *(uint *)((long)&local_9e0 + uVar62 * 4);
                  pGVar7 = (pSVar5->geometries).items[local_cc8].ptr;
                  if ((pGVar7->mask & ray->mask) == 0) {
                    uVar59 = uVar59 ^ 1L << (uVar62 & 0x3f);
                    bVar53 = true;
                  }
                  else {
                    pRVar10 = context->args;
                    if ((pRVar10->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar53 = false;
                    }
                    else {
                      local_cd4 = *(undefined4 *)(local_8e0 + uVar62 * 4);
                      local_cd0 = *(undefined4 *)(local_8c0 + uVar62 * 4);
                      local_cb0.context = context->user;
                      local_ccc = *(undefined4 *)((long)&local_a00 + uVar62 * 4);
                      local_ce0 = *(undefined4 *)(local_880 + uVar62 * 4);
                      local_cdc = local_840[uVar62 - 8];
                      local_cd8 = local_840[uVar62];
                      local_cc4 = (local_cb0.context)->instID[0];
                      local_cc0 = (local_cb0.context)->instPrimID[0];
                      local_d40 = ray->tfar;
                      ray->tfar = *(float *)(local_8a0 + uVar62 * 4);
                      local_e04 = -1;
                      local_cb0.valid = &local_e04;
                      local_cb0.geometryUserPtr = pGVar7->userPtr;
                      local_cb0.hit = (RTCHitN *)&local_ce0;
                      local_cb0.N = 1;
                      local_cb0.ray = (RTCRayN *)ray;
                      if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002e04da:
                        if (pRVar10->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar10->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar10->filter)(&local_cb0);
                            auVar219 = ZEXT1664(local_dd0);
                            auVar138 = ZEXT1664(local_dc0);
                            auVar216 = ZEXT1664(local_db0);
                            auVar212 = ZEXT1664(local_da0);
                            auVar198 = ZEXT1664(local_d90);
                            auVar188 = ZEXT1664(local_d80);
                            auVar170 = ZEXT1664(local_d70);
                            auVar166 = ZEXT1664(local_d60);
                            auVar158 = ZEXT1664(local_d50);
                          }
                          if (*local_cb0.valid == 0) goto LAB_002e056e;
                        }
                        bVar53 = false;
                      }
                      else {
                        (*pGVar7->occlusionFilterN)(&local_cb0);
                        auVar219 = ZEXT1664(local_dd0);
                        auVar138 = ZEXT1664(local_dc0);
                        auVar216 = ZEXT1664(local_db0);
                        auVar212 = ZEXT1664(local_da0);
                        auVar198 = ZEXT1664(local_d90);
                        auVar188 = ZEXT1664(local_d80);
                        auVar170 = ZEXT1664(local_d70);
                        auVar166 = ZEXT1664(local_d60);
                        auVar158 = ZEXT1664(local_d50);
                        if (*local_cb0.valid != 0) goto LAB_002e04da;
LAB_002e056e:
                        ray->tfar = local_d40;
                        uVar59 = uVar59 ^ 1L << (uVar62 & 0x3f);
                        bVar53 = true;
                      }
                    }
                  }
                  iVar57 = 0;
                  if (!bVar53) {
                    uVar59 = local_df8;
                    uVar62 = local_de0;
                    uVar66 = local_de8;
                    uVar70 = local_df0;
                    uVar74 = local_e00;
                    if (bVar75) {
                      ray->tfar = -INFINITY;
                      iVar57 = 3;
                    }
                    goto LAB_002e0681;
                  }
                } while (uVar59 != 0);
              }
              local_d00 = local_d00 + 1;
              bVar75 = local_d00 < local_d08;
            } while (local_d00 != local_d08);
            iVar57 = 0;
            uVar59 = local_df8;
            uVar62 = local_de0;
            uVar66 = local_de8;
            uVar70 = local_df0;
            uVar74 = local_e00;
          }
        }
LAB_002e0681:
      } while (iVar57 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }